

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O3

void __thiscall
TestParser_TestExpression_Test::~TestParser_TestExpression_Test
          (TestParser_TestExpression_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestExpression){
    cout << R"(
            ---- test_expression ----
            )" << endl;
    string buff = R"((7 * (3 + 4 - 4))
                    -2
                    (-3)
                    (6 + (8+9) - 8)
                    3 * 8 + (9 + 0)
                    (9) * (8-9)
                   )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(!program->Stmts.empty());
    EXPECT_EQ((int)program->Stmts.size(), 6);
    cout << program << endl;
}